

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_EnvelopePhase1(opm_t *chip)

{
  byte bVar1;
  uint uVar2;
  uint32_t konevent;
  uint32_t kon;
  uint32_t slot;
  opm_t *chip_local;
  
  uVar2 = chip->cycles + 2 & 0x1f;
  bVar1 = chip->mode_kon[uVar2] | chip->kon_csm;
  if (chip->kon[uVar2] == '\0' && bVar1 != 0) {
    chip->eg_state[uVar2] = '\0';
  }
  chip->kon2[uVar2] = chip->kon[uVar2];
  chip->kon[uVar2] = bVar1;
  return;
}

Assistant:

static void OPM_EnvelopePhase1(opm_t *chip)
{
    uint32_t slot = (chip->cycles + 2) % 32;
    uint32_t kon = chip->mode_kon[slot] | chip->kon_csm;
    uint32_t konevent = !chip->kon[slot] && kon;
    if (konevent)
    {
        chip->eg_state[slot] = eg_num_attack;
    }

    chip->kon2[slot] = chip->kon[slot];
    chip->kon[slot] = kon;
}